

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall bssl::anon_unknown_0::SSLTest_Padding_Test::TestBody(SSLTest_Padding_Test *this)

{
  bool bVar1;
  Message *pMVar2;
  char *pcVar3;
  AssertHelper local_f0;
  Message local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_2;
  size_t padded_len;
  Message local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_1;
  ScopedTrace gtest_trace_1259;
  PaddingTest *test;
  PaddingTest *__end3;
  PaddingTest *__begin3;
  PaddingTest (*__range3) [11];
  AssertHelper local_78;
  Message local_70;
  uint local_64;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  size_t base_len;
  ScopedTrace local_32;
  ScopedTrace local_31;
  ScopedTrace gtest_trace_1251;
  PaddingVersions *pPStack_30;
  ScopedTrace gtest_trace_1250;
  PaddingVersions *versions;
  PaddingVersions *__end2;
  PaddingVersions *__begin2;
  PaddingVersions (*__range2) [3];
  SSLTest_Padding_Test *this_local;
  
  __end2 = TestBody::kPaddingVersions;
  do {
    if (__end2 == (PaddingVersions *)&DAT_004cb294) {
      return;
    }
    pPStack_30 = __end2;
    testing::ScopedTrace::ScopedTrace<unsigned_short>
              (&local_31,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x4e2,&__end2->max_version);
    testing::ScopedTrace::ScopedTrace<unsigned_short>
              (&local_32,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x4e3,&pPStack_30->session_version);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )GetClientHelloLen(pPStack_30->max_version,pPStack_30->session_version,1);
    local_64 = 0;
    testing::internal::CmpHelperNE<unsigned_long,unsigned_int>
              ((internal *)local_60,"base_len","0u",(unsigned_long *)&gtest_ar.message_,&local_64);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
    if (!bVar1) {
      testing::Message::Message(&local_70);
      pMVar2 = testing::Message::operator<<
                         (&local_70,(char (*) [37])"Baseline length could not be sampled");
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x4e8,pcVar3);
      testing::internal::AssertHelper::operator=(&local_78,pMVar2);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      testing::Message::~Message(&local_70);
    }
    bVar1 = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
    if (!bVar1) {
      for (__end3 = TestBody::kPaddingTests;
          __end3 != (PaddingTest *)
                    "N7testing8internal15TestFactoryImplIN4bssl12_GLOBAL__N_125SSLTest_ClientCAList_TestEEE"
          ; __end3 = __end3 + 1) {
        testing::ScopedTrace::ScopedTrace<unsigned_long>
                  ((ScopedTrace *)
                   ((long)&gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   + 7),
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x4eb,&__end3->input_len);
        testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                  ((internal *)local_b8,"base_len","test.input_len",
                   (unsigned_long *)&gtest_ar.message_,&__end3->input_len);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
        if (!bVar1) {
          testing::Message::Message(&local_c0);
          pMVar2 = testing::Message::operator<<
                             (&local_c0,(char (*) [30])"Baseline ClientHello too long");
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&padded_len,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x4ec,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&padded_len,pMVar2);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&padded_len);
          testing::Message::~Message(&local_c0);
        }
        bVar1 = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
        if (!bVar1) {
          gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )GetClientHelloLen(pPStack_30->max_version,pPStack_30->session_version,
                                   (__end3->input_len -
                                   (long)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl) + 1);
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                    ((EqHelper *)local_e0,"padded_len","test.padded_len",
                     (unsigned_long *)&gtest_ar_2.message_,&__end3->padded_len);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
          if (!bVar1) {
            testing::Message::Message(&local_e8);
            pMVar2 = testing::Message::operator<<
                               (&local_e8,
                                (char (*) [46])"ClientHello was not padded to expected length");
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
            testing::internal::AssertHelper::AssertHelper
                      (&local_f0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x4f1,pcVar3);
            testing::internal::AssertHelper::operator=(&local_f0,pMVar2);
            testing::internal::AssertHelper::~AssertHelper(&local_f0);
            testing::Message::~Message(&local_e8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
          bVar1 = false;
        }
        testing::ScopedTrace::~ScopedTrace
                  ((ScopedTrace *)
                   ((long)&gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   + 7));
        if (bVar1) goto LAB_0017c92e;
      }
      bVar1 = false;
    }
LAB_0017c92e:
    testing::ScopedTrace::~ScopedTrace(&local_32);
    testing::ScopedTrace::~ScopedTrace(&local_31);
    if (bVar1) {
      return;
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

TEST(SSLTest, Padding) {
  struct PaddingVersions {
    uint16_t max_version, session_version;
  };
  static const PaddingVersions kPaddingVersions[] = {
      // Test the padding extension at TLS 1.2.
      {TLS1_2_VERSION, TLS1_2_VERSION},
      // Test the padding extension at TLS 1.3 with a TLS 1.2 session, so there
      // will be no PSK binder after the padding extension.
      {TLS1_3_VERSION, TLS1_2_VERSION},
      // Test the padding extension at TLS 1.3 with a TLS 1.3 session, so there
      // will be a PSK binder after the padding extension.
      {TLS1_3_VERSION, TLS1_3_VERSION},

  };

  struct PaddingTest {
    size_t input_len, padded_len;
  };
  static const PaddingTest kPaddingTests[] = {
      // ClientHellos of length below 0x100 do not require padding.
      {0xfe, 0xfe},
      {0xff, 0xff},
      // ClientHellos of length 0x100 through 0x1fb are padded up to 0x200.
      {0x100, 0x200},
      {0x123, 0x200},
      {0x1fb, 0x200},
      // ClientHellos of length 0x1fc through 0x1ff get padded beyond 0x200. The
      // padding extension takes a minimum of four bytes plus one required
      // content
      // byte. (To work around yet more server bugs, we avoid empty final
      // extensions.)
      {0x1fc, 0x201},
      {0x1fd, 0x202},
      {0x1fe, 0x203},
      {0x1ff, 0x204},
      // Finally, larger ClientHellos need no padding.
      {0x200, 0x200},
      {0x201, 0x201},
  };

  for (const PaddingVersions &versions : kPaddingVersions) {
    SCOPED_TRACE(versions.max_version);
    SCOPED_TRACE(versions.session_version);

    // Sample a baseline length.
    size_t base_len =
        GetClientHelloLen(versions.max_version, versions.session_version, 1);
    ASSERT_NE(base_len, 0u) << "Baseline length could not be sampled";

    for (const PaddingTest &test : kPaddingTests) {
      SCOPED_TRACE(test.input_len);
      ASSERT_LE(base_len, test.input_len) << "Baseline ClientHello too long";

      size_t padded_len =
          GetClientHelloLen(versions.max_version, versions.session_version,
                            1 + test.input_len - base_len);
      EXPECT_EQ(padded_len, test.padded_len)
          << "ClientHello was not padded to expected length";
    }
  }
}